

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromFile
          (TinyGLTF *this,Model *model,string *err,string *warn,string *filename,uint check_sections
          )

{
  byte bVar1;
  ostream *poVar2;
  string *in_RDX;
  uchar *in_RDI;
  string *in_R8;
  bool ret;
  string basedir;
  bool fileread;
  string fileerr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  stringstream ss;
  size_type in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  string *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd70;
  uint size;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  string *in_stack_fffffffffffffd88;
  Model *in_stack_fffffffffffffd90;
  TinyGLTF *in_stack_fffffffffffffd98;
  string local_258 [8];
  string *in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdb8;
  string local_230 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_210;
  undefined4 local_1f4;
  string local_1f0 [48];
  stringstream local_1c0 [16];
  ostream local_1b0 [384];
  string *local_30;
  string *local_20;
  byte local_1;
  
  size = (uint)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  local_30 = in_R8;
  local_20 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1c0);
  if (*(long *)(in_RDI + 0x28) == 0) {
    poVar2 = std::operator<<(local_1b0,"Failed to read file: ");
    poVar2 = std::operator<<(poVar2,local_30);
    poVar2 = std::operator<<(poVar2,": one or more FS callback not set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (local_20 != (string *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=(local_20,local_1f0);
      std::__cxx11::string::~string(local_1f0);
    }
    local_1 = 0;
    local_1f4 = 1;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1470cb);
    std::__cxx11::string::string(local_230);
    bVar1 = (**(code **)(in_RDI + 0x28))
                      (&local_210,local_230,local_30,*(undefined8 *)(in_RDI + 0x38));
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<(local_1b0,"Failed to read file: ");
      poVar2 = std::operator<<(poVar2,local_30);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,local_230);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      if (local_20 != (string *)0x0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=(local_20,local_258);
        std::__cxx11::string::~string(local_258);
      }
      local_1 = 0;
      local_1f4 = 1;
    }
    else {
      GetBaseDir(in_stack_fffffffffffffd18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                 in_stack_fffffffffffffce8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_210);
      in_stack_fffffffffffffd07 =
           LoadBinaryFromMemory
                     (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                      (string *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),in_RDI
                      ,size,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
      local_1f4 = 1;
      local_1 = in_stack_fffffffffffffd07;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
    }
    std::__cxx11::string::~string(local_230);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
  }
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return (bool)(local_1 & 1);
}

Assistant:

bool TinyGLTF::LoadBinaryFromFile(Model *model, std::string *err,
                                  std::string *warn,
                                  const std::string &filename,
                                  unsigned int check_sections) {
  std::stringstream ss;

  if (fs.ReadWholeFile == nullptr) {
    // Programmer error, assert() ?
    ss << "Failed to read file: " << filename
       << ": one or more FS callback not set" << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::vector<unsigned char> data;
  std::string fileerr;
  bool fileread = fs.ReadWholeFile(&data, &fileerr, filename, fs.user_data);
  if (!fileread) {
    ss << "Failed to read file: " << filename << ": " << fileerr << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::string basedir = GetBaseDir(filename);

  bool ret = LoadBinaryFromMemory(model, err, warn, &data.at(0),
                                  static_cast<unsigned int>(data.size()),
                                  basedir, check_sections);

  return ret;
}